

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  streamoff sVar4;
  reference pvVar5;
  undefined1 local_258 [16];
  undefined1 local_248 [2] [16];
  size_type local_228;
  streamsize size;
  ifstream file;
  string *filename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::ifstream::ifstream(&size,pcVar3,_Var2);
  local_228 = 0;
  std::istream::seekg((long)&size,_S_beg);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    local_248[0] = std::istream::tellg();
    local_228 = std::fpos::operator_cast_to_long((fpos *)local_248);
  }
  std::istream::seekg((long)&size,_S_beg);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    local_258 = std::istream::tellg();
    sVar4 = std::fpos::operator_cast_to_long((fpos *)local_258);
    local_228 = local_228 - sVar4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,local_228);
  if (0 < (long)local_228) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](buffer,0);
    std::istream::read((char *)&size,(long)pvVar5);
  }
  std::ifstream::~ifstream(&size);
  return;
}

Assistant:

void load_file(std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ifstream file(filename.c_str(), std::ios::in|std::ios::binary|std::ios::ate);

  /*get filesize*/
  std::streamsize size = 0;
  if(file.seekg(0, std::ios::end).good()) size = file.tellg();
  if(file.seekg(0, std::ios::beg).good()) size -= file.tellg();

  /*read contents of the file into the vector*/
  buffer.resize(size_t(size));
  if(size > 0) file.read((char*)(&buffer[0]), size);
}